

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_diff.cpp
# Opt level: O0

void __thiscall Diff_BuildWriteIndexValues_Test::TestBody(Diff_BuildWriteIndexValues_Test *this)

{
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> bVar4;
  database *pdVar5;
  iterator iVar6;
  UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  *matcher;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  *matchers;
  UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  *matcher_00;
  __normal_iterator<pstore::address_*,_std::vector<pstore::address,_std::allocator<pstore::address>_>_>
  in_R9;
  AssertHelper local_538;
  Message local_530;
  uint local_524;
  size_type local_520;
  undefined1 local_518 [8];
  AssertionResult gtest_ar_5;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4f8;
  undefined1 local_4e8 [8];
  vector<pstore::address,_std::allocator<pstore::address>_> actual_2;
  Message local_4c8;
  UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  local_4c0;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_>
  local_490;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_4;
  undefined1 local_440 [8];
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  actual_values_1;
  undefined1 local_418 [8];
  vector<pstore::address,_std::allocator<pstore::address>_> actual_1;
  Message local_3f8;
  void *local_3f0;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_3;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  index_1;
  Message local_3c0;
  UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  local_3b8;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_>
  local_358;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_2d8 [8];
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  actual_values;
  undefined1 local_2b0 [8];
  vector<pstore::address,_std::allocator<pstore::address>_> actual;
  Message local_290;
  void *local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_1;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  index;
  AssertHelper local_258;
  Message local_250;
  uint local_248 [2];
  undefined1 local_240 [8];
  AssertionResult gtest_ar;
  string local_228;
  extent<char> local_208;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  local_1f8;
  unique_lock<mock_mutex> local_1c8;
  undefined1 local_1b8 [8];
  transaction_type t2;
  undefined1 local_178 [8];
  string k2;
  string local_150;
  extent<char> local_130;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  local_120;
  unique_lock<mock_mutex> local_f0;
  undefined1 local_e0 [8];
  transaction_type t1;
  undefined1 local_a0 [8];
  string k1;
  undefined1 local_70 [8];
  value_type v2;
  value_type v1;
  Diff_BuildWriteIndexValues_Test *this_local;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
              *)&v2.second.size);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
              *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_a0,"key1",(allocator *)&t1.lock_.field_0xf);
  std::allocator<char>::~allocator((allocator<char> *)&t1.lock_.field_0xf);
  std::unique_lock<mock_mutex>::unique_lock(&local_f0,(mutex_type *)&(this->super_Diff).field_0x150)
  ;
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_e0,&(this->super_Diff).db_,&local_f0);
  std::unique_lock<mock_mutex>::~unique_lock(&local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_150,"first value",(allocator *)(k2.field_2._M_local_buf + 0xf));
  local_130 = anon_unknown.dwarf_bc6fc::Diff::add
                        (&this->super_Diff,(transaction_type *)local_e0,(string *)local_a0,
                         &local_150);
  std::make_pair<std::__cxx11::string_const&,pstore::extent<char>>
            (&local_120,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
             &local_130);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  ::operator=((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
               *)&v2.second.size,&local_120);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  ::~pair(&local_120);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)(k2.field_2._M_local_buf + 0xf));
  pstore::transaction_base::commit((transaction_base *)local_e0);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_e0);
  std::__cxx11::string::~string((string *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_178,"key2",(allocator *)&t2.lock_.field_0xf);
  std::allocator<char>::~allocator((allocator<char> *)&t2.lock_.field_0xf);
  std::unique_lock<mock_mutex>::unique_lock
            (&local_1c8,(mutex_type *)&(this->super_Diff).field_0x150);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_1b8,&(this->super_Diff).db_,&local_1c8
         );
  std::unique_lock<mock_mutex>::~unique_lock(&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_228,"second value",
             (allocator *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_208 = anon_unknown.dwarf_bc6fc::Diff::add
                        (&this->super_Diff,(transaction_type *)local_1b8,(string *)local_178,
                         &local_228);
  std::make_pair<std::__cxx11::string_const&,pstore::extent<char>>
            (&local_1f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
             &local_208);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  ::operator=((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
               *)local_70,&local_1f8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  ::~pair(&local_1f8);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  pstore::transaction_base::commit((transaction_base *)local_1b8);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_1b8);
  std::__cxx11::string::~string((string *)local_178);
  local_248[1] = 2;
  local_248[0] = pstore::database::get_current_revision(&(this->super_Diff).db_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_240,"2U","db_.get_current_revision ()",local_248 + 1,local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  if (bVar1) {
    pstore::index::
    get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
              ((index *)&gtest_ar_1.message_,&(this->super_Diff).db_,true);
    local_288 = (void *)0x0;
    testing::internal::
    CmpHelperNE<std::shared_ptr<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>,decltype(nullptr)>
              ((internal *)local_280,"index","nullptr",
               (shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&gtest_ar_1.message_,&local_288);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
    if (!bVar1) {
      testing::Message::Message(&local_290);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &actual.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                 ,0x72,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &actual.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_290);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &actual.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_290);
    }
    bVar1 = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
    if (!bVar1) {
      std::vector<pstore::address,_std::allocator<pstore::address>_>::vector
                ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_2b0);
      peVar3 = std::
               __shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&gtest_ar_1.message_);
      bVar4 = std::back_inserter<std::vector<pstore::address,std::allocator<pstore::address>>>
                        ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_2b0);
      actual_values.
      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)pstore::
                    diff<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                              (&(this->super_Diff).db_,peVar3,0,bVar4);
      pdVar5 = (database *)
               std::
               __shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&gtest_ar_1.message_);
      iVar6 = std::begin<std::vector<pstore::address,std::allocator<pstore::address>>>
                        ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_2b0);
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )std::end<std::vector<pstore::address,std::allocator<pstore::address>>>
                       ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_2b0);
      (anonymous_namespace)::
      addresses_to_values<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,__gnu_cxx::__normal_iterator<pstore::address*,std::vector<pstore::address,std::allocator<pstore::address>>>>
                ((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                  *)local_2d8,(_anonymous_namespace_ *)&(this->super_Diff).db_,pdVar5,
                 (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)iVar6._M_current,
                 (__normal_iterator<pstore::address_*,_std::vector<pstore::address,_std::allocator<pstore::address>_>_>
                  )gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl,in_R9);
      testing::
      UnorderedElementsAre<std::pair<std::__cxx11::string,pstore::extent<char>>,std::pair<std::__cxx11::string,pstore::extent<char>>>
                (&local_3b8,(testing *)&v2.second.size,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                  *)local_70,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                  *)iVar6._M_current);
      testing::internal::
      MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,pstore::extent<char>>,std::pair<std::__cxx11::string,pstore::extent<char>>>>>
                (&local_358,(internal *)&local_3b8,matcher);
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,pstore::extent<char>>,std::pair<std::__cxx11::string,pstore::extent<char>>>>>
      ::operator()(local_2f8,(char *)&local_358,
                   (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                    *)"actual_values");
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_>
      ::~PredicateFormatterFromMatcher(&local_358);
      testing::internal::
      UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
      ::~UnorderedElementsAreMatcher(&local_3b8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
      if (!bVar1) {
        testing::Message::Message(&local_3c0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   &index_1.
                    super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                   ,0x78,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   &index_1.
                    super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,&local_3c0);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   &index_1.
                    super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        testing::Message::~Message(&local_3c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
      std::
      vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
      ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                 *)local_2d8);
      std::vector<pstore::address,_std::allocator<pstore::address>_>::~vector
                ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_2b0);
      bVar1 = false;
    }
    std::
    shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~shared_ptr((shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&gtest_ar_1.message_);
    if (!bVar1) {
      pstore::index::
      get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
                ((index *)&gtest_ar_3.message_,&(this->super_Diff).db_,true);
      local_3f0 = (void *)0x0;
      testing::internal::
      CmpHelperNE<std::shared_ptr<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>,decltype(nullptr)>
                ((internal *)local_3e8,"index","nullptr",
                 (shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&gtest_ar_3.message_,&local_3f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
      if (!bVar1) {
        testing::Message::Message(&local_3f8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   &actual_1.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                   ,0x7e,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   &actual_1.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&local_3f8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   &actual_1.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(&local_3f8);
      }
      bVar1 = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
      if (!bVar1) {
        std::vector<pstore::address,_std::allocator<pstore::address>_>::vector
                  ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_418);
        peVar3 = std::
                 __shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&gtest_ar_3.message_);
        bVar4 = std::back_inserter<std::vector<pstore::address,std::allocator<pstore::address>>>
                          ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_418);
        actual_values_1.
        super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)pstore::
                      diff<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                                (&(this->super_Diff).db_,peVar3,1,bVar4);
        pdVar5 = (database *)
                 std::
                 __shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&gtest_ar_3.message_);
        iVar6 = std::begin<std::vector<pstore::address,std::allocator<pstore::address>>>
                          ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_418);
        gtest_ar_4.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )std::end<std::vector<pstore::address,std::allocator<pstore::address>>>
                         ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_418);
        (anonymous_namespace)::
        addresses_to_values<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,__gnu_cxx::__normal_iterator<pstore::address*,std::vector<pstore::address,std::allocator<pstore::address>>>>
                  ((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                    *)local_440,(_anonymous_namespace_ *)&(this->super_Diff).db_,pdVar5,
                   (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)iVar6._M_current,
                   (__normal_iterator<pstore::address_*,_std::vector<pstore::address,_std::allocator<pstore::address>_>_>
                    )gtest_ar_4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,in_R9);
        testing::UnorderedElementsAre<std::pair<std::__cxx11::string,pstore::extent<char>>>
                  (&local_4c0,(testing *)local_70,matchers);
        testing::internal::
        MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,pstore::extent<char>>>>>
                  (&local_490,(internal *)&local_4c0,matcher_00);
        testing::internal::
        PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,pstore::extent<char>>>>>
        ::operator()(local_460,(char *)&local_490,
                     (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                      *)"actual_values");
        testing::internal::
        PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_>
        ::~PredicateFormatterFromMatcher(&local_490);
        testing::internal::
        UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
        ::~UnorderedElementsAreMatcher(&local_4c0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
        if (!bVar1) {
          testing::Message::Message(&local_4c8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     &actual_2.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                     ,0x84,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)
                     &actual_2.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_4c8);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)
                     &actual_2.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::Message::~Message(&local_4c8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
        std::
        vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
        ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                   *)local_440);
        std::vector<pstore::address,_std::allocator<pstore::address>_>::~vector
                  ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_418);
        bVar1 = false;
      }
      std::
      shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~shared_ptr((shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&gtest_ar_3.message_);
      if (!bVar1) {
        std::vector<pstore::address,_std::allocator<pstore::address>_>::vector
                  ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_4e8);
        pdVar5 = &(this->super_Diff).db_;
        pstore::index::
        get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
                  ((index *)&local_4f8,pdVar5,true);
        peVar3 = std::
                 __shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_4f8);
        bVar4 = std::back_inserter<std::vector<pstore::address,std::allocator<pstore::address>>>
                          ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_4e8);
        gtest_ar_5.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )pstore::
               diff<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                         (pdVar5,peVar3,2,bVar4);
        std::
        shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~shared_ptr(&local_4f8);
        local_520 = std::vector<pstore::address,_std::allocator<pstore::address>_>::size
                              ((vector<pstore::address,_std::allocator<pstore::address>_> *)
                               local_4e8);
        local_524 = 0;
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                  ((EqHelper *)local_518,"actual.size ()","0U",&local_520,&local_524);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
        if (!bVar1) {
          testing::Message::Message(&local_530);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
          testing::internal::AssertHelper::AssertHelper
                    (&local_538,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                     ,0x8c,pcVar2);
          testing::internal::AssertHelper::operator=(&local_538,&local_530);
          testing::internal::AssertHelper::~AssertHelper(&local_538);
          testing::Message::~Message(&local_530);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
        std::vector<pstore::address,_std::allocator<pstore::address>_>::~vector
                  ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_4e8);
      }
    }
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
           *)local_70);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
           *)&v2.second.size);
  return;
}

Assistant:

TEST_F (Diff, BuildWriteIndexValues) {
    using ::testing::ContainerEq;
    using ::testing::WhenSortedBy;

    using value_type = std::pair<std::string, pstore::extent<char>>;
    value_type v1, v2;

    {
        std::string const k1 = "key1";
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        v1 = std::make_pair (k1, this->add (t1, k1, "first value"));
        t1.commit ();
    }
    {
        std::string const k2 = "key2";
        transaction_type t2 = begin (db_, lock_guard{mutex_});
        v2 = std::make_pair (k2, this->add (t2, k2, "second value"));
        t2.commit ();
    }
    ASSERT_EQ (2U, db_.get_current_revision ());

    {
        // Check the diff between r2 and r0.
        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        ASSERT_NE (index, nullptr);

        std::vector<pstore::address> actual;
        pstore::diff (db_, *index, 0U, std::back_inserter (actual));
        auto const actual_values =
            addresses_to_values (db_, *index, std::begin (actual), std::end (actual));
        EXPECT_THAT (actual_values, ::testing::UnorderedElementsAre (v1, v2));
    }

    {
        // Check the diff between r2 and r1.
        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        ASSERT_NE (index, nullptr);

        std::vector<pstore::address> actual;
        pstore::diff (db_, *index, 1U, std::back_inserter (actual));
        auto const actual_values =
            addresses_to_values (db_, *index, std::begin (actual), std::end (actual));
        EXPECT_THAT (actual_values, ::testing::UnorderedElementsAre (v2));
    }

    {
        // Check the diff between r2 and r2.
        std::vector<pstore::address> actual;
        pstore::diff (db_, *pstore::index::get_index<pstore::trailer::indices::write> (db_), 2U,
                      std::back_inserter (actual));
        EXPECT_EQ (actual.size (), 0U);
    }
}